

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall WrappedArgsParser::print_help(WrappedArgsParser *this)

{
  pointer pcVar1;
  ostream *poVar2;
  long *plVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  doc_formatting clipp_fmt;
  doc_string local_580;
  undefined1 local_560 [32];
  _Alloc_hider local_540;
  char local_530 [592];
  int local_2e0;
  int local_2dc;
  int local_2d8;
  doc_formatting local_2b8;
  
  memset((doc_formatting *)local_560,0,0x2a8);
  clipp::doc_formatting::doc_formatting((doc_formatting *)local_560);
  local_2e0 = 4;
  if (local_2d8 < 4) {
    local_2e0 = local_2d8;
  }
  local_2dc = 0x1c;
  if (local_2d8 < 0x1c) {
    local_2dc = local_2d8;
  }
  local_2d8 = 0x50;
  clipp::doc_formatting::doc_formatting(&local_2b8,(doc_formatting *)local_560);
  clipp::doc_formatting::~doc_formatting((doc_formatting *)local_560);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->program_name)._M_dataplus._M_p,
                      (this->program_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             " - history manager command line wrapper, which eases access to hm-db application",0x50
            );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  pcVar1 = (this->program_name)._M_dataplus._M_p;
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_580,pcVar1,pcVar1 + (this->program_name)._M_string_length);
  clipp::make_man_page((man_page *)local_560,&this->wrapper_cli,&local_580,&local_2b8);
  pbVar4 = clipp::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                             (man_page *)local_560);
  std::ios::widen((char)*(undefined8 *)(*(long *)pbVar4 + -0x18) + (char)pbVar4);
  std::ostream::put((char)pbVar4);
  std::ostream::flush();
  if (local_540._M_p != local_530) {
    operator_delete(local_540._M_p);
  }
  std::vector<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>::~vector
            ((vector<clipp::man_page::section,_std::allocator<clipp::man_page::section>_> *)
             (local_560 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p);
  }
  clipp::doc_formatting::~doc_formatting(&local_2b8);
  return;
}

Assistant:

void print_help() const {
    const auto clipp_fmt =
        doc_formatting{}.first_column(4).doc_column(28).last_column(80);

    std::cout << program_name
              << " - history manager command line wrapper, which eases access "
                 "to hm-db application"
              << std::endl
              << std::endl;
    std::cout << make_man_page(wrapper_cli, program_name, clipp_fmt)
              << std::endl;
  }